

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O3

void Curl_trc_cf_infof(Curl_easy *data,Curl_cfilter *cf,char *fmt,...)

{
  curl_trc_feat *pcVar1;
  char *pcVar2;
  char in_AL;
  int iVar3;
  int iVar4;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buffer [2050];
  __va_list_tag local_8f8;
  undefined1 local_8d8 [24];
  undefined8 local_8c0;
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  undefined8 local_838;
  char local_828 [2056];
  
  if (in_AL != '\0') {
    local_8a8 = in_XMM0_Qa;
    local_898 = in_XMM1_Qa;
    local_888 = in_XMM2_Qa;
    local_878 = in_XMM3_Qa;
    local_868 = in_XMM4_Qa;
    local_858 = in_XMM5_Qa;
    local_848 = in_XMM6_Qa;
    local_838 = in_XMM7_Qa;
  }
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
    pcVar1 = (data->state).feat;
    local_8c0 = in_RCX;
    local_8b8 = in_R8;
    local_8b0 = in_R9;
    if (pcVar1 == (curl_trc_feat *)0x0) {
      if (cf == (Curl_cfilter *)0x0) {
        return;
      }
      if (cf->cft->log_level < 1) {
        return;
      }
      iVar3 = 0;
    }
    else {
      if (cf == (Curl_cfilter *)0x0) {
        return;
      }
      if (pcVar1->log_level < 1) {
        return;
      }
      if (cf->cft->log_level < 1) {
        return;
      }
      iVar3 = curl_msnprintf(local_828,0x800,"[%s] ",pcVar1->name);
    }
    pcVar2 = cf->cft->name;
    if (cf->sockindex == 0) {
      iVar4 = curl_msnprintf(local_828 + iVar3,(long)(0x800 - iVar3),"[%s] ",pcVar2);
    }
    else {
      iVar4 = curl_msnprintf(local_828 + iVar3,(long)(0x800 - iVar3),"[%s-%d] ",pcVar2);
    }
    iVar4 = iVar4 + iVar3;
    local_8f8.reg_save_area = local_8d8;
    local_8f8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_8f8.gp_offset = 0x18;
    local_8f8.fp_offset = 0x30;
    iVar3 = curl_mvsnprintf(local_828 + iVar4,(long)(0x800 - iVar4),fmt,&local_8f8);
    (local_828 + (iVar3 + iVar4))[0] = '\n';
    (local_828 + (iVar3 + iVar4))[1] = '\0';
    Curl_debug(data,CURLINFO_TEXT,local_828,(long)(iVar3 + iVar4) + 1);
  }
  return;
}

Assistant:

void Curl_trc_cf_infof(struct Curl_easy *data, struct Curl_cfilter *cf,
                       const char *fmt, ...)
{
  DEBUGASSERT(cf);
  if(Curl_trc_cf_is_verbose(cf, data)) {
    va_list ap;
    int len = 0;
    char buffer[MAXINFO + 2];
    if(data->state.feat)
      len += msnprintf(buffer + len, MAXINFO - len, "[%s] ",
                       data->state.feat->name);
    if(cf->sockindex)
      len += msnprintf(buffer + len, MAXINFO - len, "[%s-%d] ",
                      cf->cft->name, cf->sockindex);
    else
      len += msnprintf(buffer + len, MAXINFO - len, "[%s] ", cf->cft->name);
    va_start(ap, fmt);
    len += mvsnprintf(buffer + len, MAXINFO - len, fmt, ap);
    va_end(ap);
    buffer[len++] = '\n';
    buffer[len] = '\0';
    Curl_debug(data, CURLINFO_TEXT, buffer, len);
  }
}